

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O2

void outputProblemToLaTeX(Problem *prb)

{
  Unit **ppUVar1;
  ostream *poVar2;
  uint index;
  UnitList *pUVar3;
  LaTeX latex;
  string local_240;
  ofstream latexOut;
  
  std::__cxx11::string::string((string *)&local_240,(string *)(Lib::env + 0x6a70));
  std::ofstream::ofstream(&latexOut,local_240._M_dataplus._M_p,_S_out);
  std::__cxx11::string::~string((string *)&local_240);
  Shell::LaTeX::header_abi_cxx11_(&local_240,&latex);
  poVar2 = std::operator<<((ostream *)&latexOut,(string *)&local_240);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_240);
  poVar2 = std::operator<<((ostream *)&latexOut,"\\section{Problem ");
  poVar2 = std::operator<<(poVar2,(string *)(Lib::env + 0x82d8));
  poVar2 = std::operator<<(poVar2,"}");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&latexOut,"\\[\n\\begin{array}{ll}");
  std::endl<char,std::char_traits<char>>(poVar2);
  pUVar3 = prb->_units;
  index = 0;
  while (pUVar3 != (UnitList *)0x0) {
    ppUVar1 = &pUVar3->_head;
    pUVar3 = pUVar3->_tail;
    outputUnitToLaTeX(&latex,&latexOut,*ppUVar1,index);
    index = index + 1;
  }
  poVar2 = std::operator<<((ostream *)&latexOut,"\\end{array}\n\\]");
  Shell::LaTeX::footer_abi_cxx11_(&local_240,&latex);
  poVar2 = std::operator<<(poVar2,(string *)&local_240);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_240);
  std::ofstream::~ofstream(&latexOut);
  return;
}

Assistant:

void outputProblemToLaTeX(Problem* prb)
{
  ASS(env.options->latexOutput()!="off");

  LaTeX latex;
  ofstream latexOut(env.options->latexOutput().c_str());
  latexOut << latex.header() << endl;
  latexOut << "\\section{Problem "<<env.options->problemName() << "}" << endl;
  //TODO output more header
  latexOut << "\\[\n\\begin{array}{ll}" << endl;

  //TODO  get symbol and sort declarations into LaTeX

  UnitList::Iterator units(prb->units());

  unsigned index = 0;
  while (units.hasNext()) {
    Unit* u = units.next();
    outputUnitToLaTeX(latex,latexOut,u,index++);
  }
  latexOut  << "\\end{array}\n\\]" << latex.footer() << "\n";

  //close ofstream?
}